

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerApp::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::CommissionerApp> *aCommApp,Config *aConfig)

{
  bool bVar1;
  CommissionerApp *this;
  element_type *peVar2;
  Error *aError;
  size_type sVar3;
  Error local_a0;
  ErrorCode local_74;
  Error local_70;
  undefined1 local_38 [8];
  shared_ptr<ot::commissioner::CommissionerApp> app;
  Config *aConfig_local;
  shared_ptr<ot::commissioner::CommissionerApp> *aCommApp_local;
  Error *error;
  
  app.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  this = (CommissionerApp *)operator_new(0x368);
  memset(this,0,0x368);
  CommissionerApp(this);
  std::shared_ptr<ot::commissioner::CommissionerApp>::
  shared_ptr<ot::commissioner::CommissionerApp,void>
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38,this);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  Init(&local_70,peVar2,aConfig);
  aError = Error::operator=(__return_storage_ptr__,&local_70);
  local_74 = kNone;
  bVar1 = commissioner::operator!=(aError,&local_74);
  Error::~Error(&local_70);
  if (!bVar1) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&aConfig->mCommissionerToken);
    if (sVar3 != 0) {
      peVar2 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                (&local_a0,peVar2,&aConfig->mCommissionerToken);
      Error::IgnoreError(&local_a0);
      Error::~Error(&local_a0);
    }
    std::shared_ptr<ot::commissioner::CommissionerApp>::operator=
              (aCommApp,(shared_ptr<ot::commissioner::CommissionerApp> *)local_38);
  }
  app.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38);
  if ((app.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Create(std::shared_ptr<CommissionerApp> &aCommApp, const Config &aConfig)
{
    Error error;
    auto  app = std::shared_ptr<CommissionerApp>(new CommissionerApp());

    SuccessOrExit(error = app->Init(aConfig));
    if (aConfig.mCommissionerToken.size() > 0)
    {
        app->SetToken(aConfig.mCommissionerToken).IgnoreError();
    }

    aCommApp = app;

exit:
    return error;
}